

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int set_str_utf16be(archive_write *a,uchar *p,char *s,size_t l,uint16_t uf,vdc vdc)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  ulong in_RCX;
  short *in_RDX;
  uchar *in_RSI;
  archive *in_RDI;
  uint16_t in_R8W;
  int in_R9D;
  bool bVar4;
  uint16_t *u16;
  iso9660_conflict *iso9660;
  int onepad;
  size_t i;
  size_t size;
  archive_string_conv *sc;
  void *in_stack_ffffffffffffffa8;
  short *psVar5;
  archive_string *as;
  ulong local_40;
  ulong local_38;
  ulong local_28;
  short *local_20;
  uchar *local_18;
  
  local_20 = in_RDX;
  if (in_RDX == (short *)0x0) {
    local_20 = (short *)0x1b1753;
  }
  bVar4 = (in_RCX & 1) != 0;
  local_28 = in_RCX;
  if (bVar4) {
    local_28 = in_RCX & 0xfffffffffffffffe;
  }
  if (in_R9D == 2) {
    as = *(archive_string **)&in_RDI[1].current_codepage;
    sc = (archive_string_conv *)(as + 3);
    strlen((char *)local_20);
    wVar1 = archive_strncpy_l(as,in_stack_ffffffffffffffa8,(size_t)local_20,sc);
    if ((wVar1 != L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory for UTF-16BE");
      return -0x1e;
    }
    local_38 = as[3].length;
    if (local_28 < local_38) {
      local_38 = local_28;
    }
    memcpy(in_RSI,as[3].s,local_38);
  }
  else {
    local_38 = 0;
    psVar5 = local_20;
    while (*psVar5 != 0) {
      local_38 = local_38 + 2;
      psVar5 = psVar5 + 1;
    }
    if (local_28 < local_38) {
      local_38 = local_28;
    }
    memcpy(in_RSI,local_20,local_38);
  }
  local_18 = in_RSI;
  for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 2) {
    iVar2 = joliet_allowed_char(*local_18,local_18[1]);
    if (iVar2 == 0) {
      archive_be16enc(local_18,0x5f);
    }
    local_18 = local_18 + 2;
  }
  for (local_28 = local_28 - local_38; local_28 != 0; local_28 = local_28 + -2) {
    archive_be16enc(local_18,in_R8W);
    local_18 = local_18 + 2;
  }
  if (bVar4) {
    *local_18 = '\0';
  }
  return 0;
}

Assistant:

static int
set_str_utf16be(struct archive_write *a, unsigned char *p, const char *s,
    size_t l, uint16_t uf, enum vdc vdc)
{
	size_t size, i;
	int onepad;

	if (s == NULL)
		s = "";
	if (l & 0x01) {
		onepad = 1;
		l &= ~1;
	} else
		onepad = 0;
	if (vdc == VDC_UCS2) {
		struct iso9660 *iso9660 = a->format_data;
		if (archive_strncpy_l(&iso9660->utf16be, s, strlen(s),
		    iso9660->sconv_to_utf16be) != 0 && errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for UTF-16BE");
			return (ARCHIVE_FATAL);
		}
		size = iso9660->utf16be.length;
		if (size > l)
			size = l;
		memcpy(p, iso9660->utf16be.s, size);
	} else {
		const uint16_t *u16 = (const uint16_t *)s;

		size = 0;
		while (*u16++)
			size += 2;
		if (size > l)
			size = l;
		memcpy(p, s, size);
	}
	for (i = 0; i < size; i += 2, p += 2) {
		if (!joliet_allowed_char(p[0], p[1]))
			archive_be16enc(p, 0x005F);/* '_' */
	}
	l -= size;
	while (l > 0) {
		archive_be16enc(p, uf);
		p += 2;
		l -= 2;
	}
	if (onepad)
		*p = 0;
	return (ARCHIVE_OK);
}